

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.c
# Opt level: O0

riff * riff_parse(DUMBFILE *f,int32 offset,int32 size,uint proper)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  uint uVar4;
  riff_chunk *prVar5;
  riff *prVar6;
  int32 in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  DUMBFILE *in_RDI;
  riff_chunk *chunk;
  riff *stream;
  uint stream_size;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  byte bVar7;
  riff_chunk *in_stack_ffffffffffffffd0;
  DUMBFILE *local_8;
  
  if ((int)in_EDX < 8) {
    local_8 = (DUMBFILE *)0x0;
  }
  else {
    iVar1 = dumbfile_seek((DUMBFILE *)in_stack_ffffffffffffffd0,
                          CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
    if (iVar1 == 0) {
      iVar2 = dumbfile_mgetl((DUMBFILE *)
                             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      if (iVar2 == 0x52494646) {
        uVar3 = dumbfile_igetl((DUMBFILE *)
                               CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
        if (in_EDX < uVar3 + 8) {
          local_8 = (DUMBFILE *)0x0;
        }
        else if (uVar3 < 4) {
          local_8 = (DUMBFILE *)0x0;
        }
        else {
          local_8 = (DUMBFILE *)malloc(0x10);
          if (local_8 == (DUMBFILE *)0x0) {
            local_8 = (DUMBFILE *)0x0;
          }
          else {
            uVar4 = dumbfile_mgetl((DUMBFILE *)
                                   CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
            *(uint *)&local_8->dfs = uVar4;
            *(uint *)((long)&local_8->dfs + 4) = 0;
            local_8->file = (riff_chunk *)0x0;
            uVar3 = uVar3 - 4;
            while( true ) {
              bVar7 = 0;
              if (uVar3 != 0) {
                iVar1 = dumbfile_error(in_RDI);
                bVar7 = iVar1 != 0 ^ 0xff;
              }
              if (((bVar7 & 1) == 0) || (uVar3 < 8)) break;
              prVar5 = (riff_chunk *)
                       realloc((riff_chunk *)local_8->file,
                               (ulong)(*(uint *)((long)&local_8->dfs + 4) + 1) * 0x18);
              local_8->file = prVar5;
              if ((riff_chunk *)local_8->file == (riff_chunk *)0x0) break;
              in_stack_ffffffffffffffd0 =
                   (riff_chunk *)local_8->file + *(uint *)((long)&local_8->dfs + 4);
              uVar4 = dumbfile_mgetl((DUMBFILE *)CONCAT17(bVar7,in_stack_ffffffffffffffc8));
              in_stack_ffffffffffffffd0->type = uVar4;
              uVar4 = dumbfile_igetl((DUMBFILE *)CONCAT17(bVar7,in_stack_ffffffffffffffc8));
              in_stack_ffffffffffffffd0->size = uVar4;
              iVar2 = dumbfile_pos(in_RDI);
              in_stack_ffffffffffffffd0->offset = iVar2;
              uVar3 = uVar3 - 8;
              if (uVar3 < in_stack_ffffffffffffffd0->size) break;
              if (in_stack_ffffffffffffffd0->type == 0x52494646) {
                prVar6 = riff_parse((DUMBFILE *)CONCAT44(in_ESI,in_EDX),in_ECX,uVar3,
                                    (uint)((ulong)local_8 >> 0x20));
                in_stack_ffffffffffffffd0->nested = prVar6;
                if (in_stack_ffffffffffffffd0->nested == (riff *)0x0) break;
              }
              else {
                in_stack_ffffffffffffffd0->nested = (riff *)0x0;
              }
              dumbfile_seek((DUMBFILE *)in_stack_ffffffffffffffd0,
                            CONCAT17(bVar7,in_stack_ffffffffffffffc8),0);
              uVar3 = uVar3 - in_stack_ffffffffffffffd0->size;
              if ((in_ECX != 0) && ((in_stack_ffffffffffffffd0->size & 1) != 0)) {
                dumbfile_skip(local_8,(long)in_stack_ffffffffffffffd0);
                uVar3 = uVar3 - 1;
              }
              *(uint *)((long)&local_8->dfs + 4) = *(uint *)((long)&local_8->dfs + 4) + 1;
            }
            if (uVar3 != 0) {
              riff_free((riff *)in_stack_ffffffffffffffd0);
              local_8 = (DUMBFILE *)0x0;
            }
          }
        }
      }
      else {
        local_8 = (DUMBFILE *)0x0;
      }
    }
    else {
      local_8 = (DUMBFILE *)0x0;
    }
  }
  return (riff *)local_8;
}

Assistant:

struct riff * riff_parse( DUMBFILE * f, int32 offset, int32 size, unsigned proper )
{
	unsigned stream_size;
	struct riff * stream;


    if ( size < 8 ) return 0;

    if ( dumbfile_seek(f, offset, DFS_SEEK_SET) ) return 0;
    if ( dumbfile_mgetl(f) != DUMB_ID('R','I','F','F') ) return 0;

    stream_size = dumbfile_igetl(f);
    if ( stream_size + 8 > (unsigned)size ) return 0;
	if ( stream_size < 4 ) return 0;

    stream = (struct riff *) malloc( sizeof( struct riff ) );
	if ( ! stream ) return 0;

    stream->type = dumbfile_mgetl(f);
	stream->chunk_count = 0;
	stream->chunks = 0;

	stream_size -= 4;

    while ( stream_size && !dumbfile_error(f) )
	{
		struct riff_chunk * chunk;
		if ( stream_size < 8 ) break;
        stream->chunks = ( struct riff_chunk * ) realloc( stream->chunks, ( stream->chunk_count + 1 ) * sizeof( struct riff_chunk ) );
		if ( ! stream->chunks ) break;
		chunk = stream->chunks + stream->chunk_count;
        chunk->type = dumbfile_mgetl(f);
        chunk->size = dumbfile_igetl(f);
        chunk->offset = dumbfile_pos(f);
		stream_size -= 8;
		if ( stream_size < chunk->size ) break;
        if ( chunk->type == DUMB_ID('R','I','F','F') )
		{
            chunk->nested = riff_parse( f, chunk->offset - 8, chunk->size + 8, proper );
            if ( ! chunk->nested ) break;
		}
		else
		{
            chunk->nested = 0;
		}
        dumbfile_seek(f, chunk->offset + chunk->size, DFS_SEEK_SET);
		stream_size -= chunk->size;
		if ( proper && ( chunk->size & 1 ) )
		{
            dumbfile_skip(f, 1);
			-- stream_size;
		}
		++stream->chunk_count;
	}
	
	if ( stream_size )
	{
		riff_free( stream );
		stream = 0;
	}

	return stream;
}